

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.cpp
# Opt level: O0

void __thiscall
hmm::hmm(hmm *this,
        unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
        *switchRate,string *code1,string *qual1,string *code2,string *qual2,int minGCPositions)

{
  string *in_RCX;
  string *in_RDX;
  long in_RDI;
  string *in_R8;
  string *in_R9;
  undefined4 in_stack_00000008;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *in_stack_ffffffffffffff28;
  
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)0x2726e7);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)0x2726fd);
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)0x272713);
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)0x27272c);
  std::
  unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
  ::unordered_map((unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
                   *)0x272745);
  std::
  unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
  ::unordered_map((unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
                   *)0x27275e);
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)0x272777);
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)0x272790);
  std::__cxx11::string::string((string *)(in_RDI + 0x1c8));
  std::__cxx11::string::string((string *)(in_RDI + 0x1e8));
  std::__cxx11::string::string((string *)(in_RDI + 0x208));
  std::__cxx11::string::string((string *)(in_RDI + 0x228));
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::operator=((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)in_R9,in_stack_ffffffffffffff28);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1c8),in_RDX);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x208),in_R8);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1e8),in_RCX);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x228),in_R9);
  *(undefined4 *)(in_RDI + 0x248) = in_stack_00000008;
  return;
}

Assistant:

hmm::hmm(std::unordered_map<int, double> switchRate,string code1, string qual1, string code2, string qual2,int minGCPositions){
    this->switchRateMap = switchRate;
    this->code1 = code1;
    this->code2 = code2;
    this-> qual1 = qual1;
    this-> qual2 = qual2;
    this->minGCPositions = minGCPositions;
}